

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  AMDShaderTrinaryMinMax op;
  allocator local_51;
  string local_50 [36];
  uint32_t local_2c;
  uint32_t *puStack_28;
  uint32_t param_6_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_2c = param_5;
  puStack_28 = args;
  args_local._4_4_ = eop;
  local_18 = id;
  eop_local = result_type;
  _id_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_50,"GL_AMD_shader_trinary_minmax",&local_51);
  require_extension_internal(this,(string *)local_50);
  ::std::__cxx11::string::~string(local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (args_local._4_4_ - 1 < 3) {
    emit_trinary_func_op(this,eop_local,local_18,*puStack_28,puStack_28[1],puStack_28[2],"min3");
  }
  else if (args_local._4_4_ - 4 < 3) {
    emit_trinary_func_op(this,eop_local,local_18,*puStack_28,puStack_28[1],puStack_28[2],"max3");
  }
  else if (args_local._4_4_ - 7 < 3) {
    emit_trinary_func_op(this,eop_local,local_18,*puStack_28,puStack_28[1],puStack_28[2],"mid3");
  }
  else {
    statement<char_const(&)[51],unsigned_int&>
              (this,(char (*) [51])"// unimplemented SPV AMD shader trinary minmax op ",
               (uint *)((long)&args_local + 4));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_shader_trinary_minmax_op(uint32_t result_type, uint32_t id, uint32_t eop,
                                                         const uint32_t *args, uint32_t)
{
	require_extension_internal("GL_AMD_shader_trinary_minmax");

	enum AMDShaderTrinaryMinMax
	{
		FMin3AMD = 1,
		UMin3AMD = 2,
		SMin3AMD = 3,
		FMax3AMD = 4,
		UMax3AMD = 5,
		SMax3AMD = 6,
		FMid3AMD = 7,
		UMid3AMD = 8,
		SMid3AMD = 9
	};

	auto op = static_cast<AMDShaderTrinaryMinMax>(eop);

	switch (op)
	{
	case FMin3AMD:
	case UMin3AMD:
	case SMin3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "min3");
		break;

	case FMax3AMD:
	case UMax3AMD:
	case SMax3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "max3");
		break;

	case FMid3AMD:
	case UMid3AMD:
	case SMid3AMD:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mid3");
		break;

	default:
		statement("// unimplemented SPV AMD shader trinary minmax op ", eop);
		break;
	}
}